

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

UBool __thiscall icu_63::OlsonTimeZone::operator==(OlsonTimeZone *this,TimeZone *other)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  bool local_29;
  bool local_19;
  TimeZone *other_local;
  OlsonTimeZone *this_local;
  
  local_19 = true;
  if (this != (OlsonTimeZone *)other) {
    if (this == (OlsonTimeZone *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator==
                      ((type_info *)
                       (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1],
                       (type_info *)(other->super_UObject)._vptr_UObject[-1]);
    local_29 = false;
    if (bVar1) {
      UVar2 = TimeZone::operator==((TimeZone *)this,other);
      local_29 = false;
      if (UVar2 != '\0') {
        iVar3 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xb])
                          (this,other);
        local_29 = (char)iVar3 != '\0';
      }
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

UBool OlsonTimeZone::operator==(const TimeZone& other) const {
    return ((this == &other) ||
            (typeid(*this) == typeid(other) &&
            TimeZone::operator==(other) &&
            hasSameRules(other)));
}